

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic.c
# Opt level: O3

int test_cube(void)

{
  undefined8 uVar1;
  int iVar2;
  MTBDD vars;
  uint64_t uVar3;
  BDD BVar4;
  double b;
  BDD BVar5;
  MTBDD MVar6;
  long lVar7;
  int iVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint8_t arr [6];
  uint8_t cube [6];
  uint8_t check [6];
  undefined1 local_e0 [24];
  BDD local_c8;
  undefined8 local_c0;
  uint8_t local_9e [6];
  BDD local_98;
  ulong local_90;
  uint8_t local_86 [6];
  undefined4 local_80;
  undefined2 local_7c;
  uint8_t local_78 [8];
  undefined4 local_70;
  undefined2 local_6c;
  uint8_t local_68 [8];
  undefined4 local_60;
  undefined2 local_5c;
  uint8_t local_58 [8];
  uint8_t local_50 [8];
  uint32_t local_48 [6];
  
  local_48[0] = 1;
  local_48[1] = 2;
  local_48[2] = 3;
  local_48[3] = 4;
  local_48[4] = 6;
  local_48[5] = 8;
  vars = mtbdd_set_from_array(local_48,6);
  lVar7 = 0;
  do {
    uVar3 = xorshift_rand();
    auVar10._8_4_ = (int)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._12_4_ = 0x45300000;
    local_9e[lVar7] =
         (uint8_t)(int)(((auVar10._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                        5.421010862427522e-20 * 3.0 + 0.0);
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  BVar4 = sylvan_cube(vars,local_9e);
  sylvan_sat_one(BVar4,vars,local_86);
  lVar7 = 0;
  do {
    if ((local_9e[lVar7] != local_86[lVar7]) &&
       ((local_9e[lVar7] != '\x02' || (local_86[lVar7] != '\0')))) {
      test_cube_cold_1();
      return 1;
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  b = (double)sylvan_sat_single(BVar4,vars);
  local_e0._0_8_ = sylvan_and_WRAP;
  local_e0._8_8_ = (_Worker *)0x1;
  local_c0._0_1_ = '\0';
  local_c0._1_1_ = '\0';
  local_c0._2_1_ = '\0';
  local_c0._3_1_ = '\0';
  local_e0._16_8_ = b;
  local_c8 = BVar4;
  lace_run_task((Task *)local_e0);
  iVar2 = testEqual(local_e0._16_8_,(BDD)b);
  if (iVar2 == 0) {
    test_cube_cold_25();
  }
  else {
    local_e0._0_8_ = sylvan_satcount_WRAP;
    local_e0._8_8_ = (_Worker *)0x1;
    local_c0._0_1_ = '\0';
    local_c0._1_1_ = '\0';
    local_c0._2_1_ = '\0';
    local_c0._3_1_ = '\0';
    local_e0._16_8_ = b;
    local_c8 = vars;
    lace_run_task((Task *)local_e0);
    if (((double)local_e0._16_8_ != 1.0) || (NAN((double)local_e0._16_8_))) {
      __assert_fail("sylvan_satcount(picked_single, vars)==1",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/test/test_basic.c"
                    ,0xcb,"int test_cube()");
    }
    BVar5 = sylvan_sat_one_bdd(BVar4);
    local_e0._0_8_ = sylvan_and_WRAP;
    local_e0._8_8_ = (_Worker *)0x1;
    local_c0 = (uint8_t *)((ulong)local_c0._4_4_ << 0x20);
    local_e0._16_8_ = BVar5;
    local_c8 = BVar4;
    lace_run_task((Task *)local_e0);
    iVar2 = testEqual(local_e0._16_8_,BVar5);
    if (iVar2 == 0) {
      test_cube_cold_24();
    }
    else {
      builtin_memcpy(local_50,"\x01\x01\x02\x02",5);
      local_50[5] = '\0';
      BVar4 = sylvan_cube(vars,local_50);
      builtin_memcpy(local_58,"\x01\x01\x01",4);
      local_58[4] = '\0';
      local_58[5] = '\x02';
      BVar5 = sylvan_cube(vars,local_58);
      local_c0 = (uint8_t *)&local_60;
      local_60 = 0x10101;
      local_5c = 0x200;
      local_e0._0_8_ = sylvan_union_cube_WRAP;
      local_e0._8_8_ = (_Worker *)0x1;
      local_e0._16_8_ = BVar4;
      local_c8 = vars;
      lace_run_task((Task *)local_e0);
      uVar1 = local_e0._16_8_;
      local_e0._16_8_ = BVar4 ^ 0x8000000000000000;
      local_c8 = BVar5 ^ 0x8000000000000000;
      local_e0._0_8_ = sylvan_and_WRAP;
      local_e0._8_8_ = (_Worker *)0x1;
      local_c0 = (uint8_t *)((ulong)local_c0 & 0xffffffff00000000);
      local_98 = BVar4;
      local_90 = local_e0._16_8_;
      lace_run_task((Task *)local_e0);
      iVar2 = testEqual(uVar1,local_e0._16_8_ ^ 0x8000000000000000);
      if (iVar2 == 0) {
        test_cube_cold_23();
      }
      else {
        builtin_memcpy(local_68,"\x02\x02\x02\x01\x01",6);
        BVar4 = sylvan_cube(vars,local_68);
        local_c0 = (uint8_t *)&local_70;
        local_70 = 0x1020202;
        local_6c = 1;
        local_e0._0_8_ = sylvan_union_cube_WRAP;
        local_e0._8_8_ = (_Worker *)0x1;
        local_e0._16_8_ = local_98;
        local_c8 = vars;
        lace_run_task((Task *)local_e0);
        uVar1 = local_e0._16_8_;
        local_c8 = BVar4 ^ 0x8000000000000000;
        local_e0._0_8_ = sylvan_and_WRAP;
        local_e0._8_8_ = (_Worker *)0x1;
        local_e0._16_8_ = local_90;
        local_c0 = (uint8_t *)((ulong)local_c0 & 0xffffffff00000000);
        lace_run_task((Task *)local_e0);
        iVar2 = testEqual(uVar1,local_e0._16_8_ ^ 0x8000000000000000);
        if (iVar2 == 0) {
          test_cube_cold_22();
        }
        else {
          builtin_memcpy(local_78,"\x01\x01\x01",4);
          iVar8 = 0;
          local_78[4] = '\0';
          local_78[5] = '\0';
          BVar4 = sylvan_cube(vars,local_78);
          local_c0 = (uint8_t *)&local_80;
          local_80 = 0x10101;
          local_7c = 0;
          local_e0._0_8_ = sylvan_union_cube_WRAP;
          local_e0._8_8_ = (_Worker *)0x1;
          local_e0._16_8_ = local_98;
          local_c8 = vars;
          lace_run_task((Task *)local_e0);
          uVar1 = local_e0._16_8_;
          local_c8 = BVar4 ^ 0x8000000000000000;
          local_e0._0_8_ = sylvan_and_WRAP;
          local_e0._8_8_ = (_Worker *)0x1;
          local_e0._16_8_ = local_90;
          local_c0 = (uint8_t *)((ulong)local_c0 & 0xffffffff00000000);
          lace_run_task((Task *)local_e0);
          iVar2 = testEqual(uVar1,local_e0._16_8_ ^ 0x8000000000000000);
          if (iVar2 == 0) {
            test_cube_cold_21();
          }
          else {
            local_98 = make_random(1,0x10);
            local_90 = local_98 ^ 0x8000000000000000;
            do {
              lVar7 = 0;
              do {
                uVar3 = xorshift_rand();
                auVar11._8_4_ = (int)(uVar3 >> 0x20);
                auVar11._0_8_ = uVar3;
                auVar11._12_4_ = 0x45300000;
                local_9e[lVar7] =
                     (uint8_t)(int)(((auVar11._8_8_ - 1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0))
                                    * 5.421010862427522e-20 * 3.0 + 0.0);
                lVar7 = lVar7 + 1;
              } while (lVar7 != 6);
              BVar4 = sylvan_cube(vars,local_9e);
              local_e0._0_8_ = sylvan_union_cube_WRAP;
              local_e0._8_8_ = (_Worker *)0x1;
              local_e0._16_8_ = local_98;
              local_c8 = vars;
              local_c0 = local_9e;
              lace_run_task((Task *)local_e0);
              uVar1 = local_e0._16_8_;
              local_c8 = BVar4 ^ 0x8000000000000000;
              local_e0._0_8_ = sylvan_and_WRAP;
              local_e0._8_8_ = (_Worker *)0x1;
              local_e0._16_8_ = local_90;
              local_c0 = (uint8_t *)((ulong)local_c0 & 0xffffffff00000000);
              lace_run_task((Task *)local_e0);
              BVar4 = local_98;
              if ((uVar1 ^ local_e0._16_8_) != 0x8000000000000000) {
                test_cube_cold_2();
                return 1;
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 != 10);
            iVar2 = 10;
            do {
              BVar5 = sylvan_sat_one_bdd(BVar4);
              local_e0._0_8_ = sylvan_and_WRAP;
              local_e0._8_8_ = (_Worker *)0x1;
              local_c8 = BVar4;
              local_c0 = (uint8_t *)((ulong)local_c0 & 0xffffffff00000000);
              local_e0._16_8_ = BVar5;
              lace_run_task((Task *)local_e0);
              iVar8 = testEqual(local_e0._16_8_,BVar5);
              if (iVar8 == 0) {
                test_cube_cold_20();
                return 1;
              }
              iVar2 = iVar2 + -1;
            } while (iVar2 != 0);
            MVar6 = mtbdd_enum_all_first(0x8000000000000000,vars,local_e0,(mtbdd_enum_filter_cb)0x0)
            ;
            if (MVar6 == 0x8000000000000000) {
              MVar6 = mtbdd_enum_all_first
                                (0x8000000000000000,vars,local_e0,(mtbdd_enum_filter_cb)0x0);
              if (MVar6 == 0x8000000000000000) {
                if (((local_e0._0_4_ == 0) && (local_e0[4] == '\0')) && (local_e0[5] == '\0')) {
                  MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,local_e0,
                                              (mtbdd_enum_filter_cb)0x0);
                  if (MVar6 == 0x8000000000000000) {
                    if (((local_e0._0_4_ == 0) && (local_e0[4] == '\0')) && (local_e0[5] == '\x01'))
                    {
                      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,local_e0,
                                                  (mtbdd_enum_filter_cb)0x0);
                      if (MVar6 == 0x8000000000000000) {
                        if (((local_e0._0_4_ == 0) && (local_e0[4] == '\x01')) &&
                           (local_e0[5] == '\0')) {
                          MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,local_e0,
                                                      (mtbdd_enum_filter_cb)0x0);
                          if (MVar6 == 0x8000000000000000) {
                            if (((local_e0._0_4_ == 0) && (local_e0[4] == '\x01')) &&
                               (local_e0[5] == '\x01')) {
                              MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,local_e0,
                                                          (mtbdd_enum_filter_cb)0x0);
                              if (MVar6 == 0x8000000000000000) {
                                if (((local_e0._0_4_ == 0x1000000) && (local_e0[4] == '\0')) &&
                                   (local_e0[5] == '\0')) {
                                  MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,local_e0,
                                                              (mtbdd_enum_filter_cb)0x0);
                                  if (MVar6 == 0x8000000000000000) {
                                    if (((local_e0._0_4_ == 0x1000000) && (local_e0[4] == '\0')) &&
                                       (local_e0[5] == '\x01')) {
                                      MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,local_e0,
                                                                  (mtbdd_enum_filter_cb)0x0);
                                      if (MVar6 == 0x8000000000000000) {
                                        if (((local_e0._0_4_ == 0x1000000) &&
                                            (local_e0[4] == '\x01')) && (local_e0[5] == '\0')) {
                                          mtbdd_enum_all_first
                                                    (0x8000000000000000,vars,local_e0,
                                                     (mtbdd_enum_filter_cb)0x0);
                                          MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,
                                                                      local_e0,(mtbdd_enum_filter_cb
                                                                               )0x0);
                                          if (MVar6 != 0) {
                                            lVar7 = 0x3f;
                                            do {
                                              bVar9 = lVar7 == 0;
                                              lVar7 = lVar7 + -1;
                                              if (bVar9) {
                                                test_cube_cold_18();
                                                return 1;
                                              }
                                              MVar6 = mtbdd_enum_all_next(0x8000000000000000,vars,
                                                                          local_e0,(
                                                  mtbdd_enum_filter_cb)0x0);
                                            } while (MVar6 != 0);
                                            if (lVar7 == 0) {
                                              return 0;
                                            }
                                          }
                                          test_cube_cold_19();
                                        }
                                        else {
                                          test_cube_cold_17();
                                        }
                                      }
                                      else {
                                        test_cube_cold_16();
                                      }
                                    }
                                    else {
                                      test_cube_cold_15();
                                    }
                                  }
                                  else {
                                    test_cube_cold_14();
                                  }
                                }
                                else {
                                  test_cube_cold_13();
                                }
                              }
                              else {
                                test_cube_cold_12();
                              }
                            }
                            else {
                              test_cube_cold_11();
                            }
                          }
                          else {
                            test_cube_cold_10();
                          }
                        }
                        else {
                          test_cube_cold_9();
                        }
                      }
                      else {
                        test_cube_cold_8();
                      }
                    }
                    else {
                      test_cube_cold_7();
                    }
                  }
                  else {
                    test_cube_cold_6();
                  }
                }
                else {
                  test_cube_cold_5();
                }
              }
              else {
                test_cube_cold_4();
              }
            }
            else {
              test_cube_cold_3();
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int
test_cube()
{
    const BDDSET vars = sylvan_set_fromarray(((BDDVAR[]){1,2,3,4,6,8}), 6);

    uint8_t cube[6], check[6];
    int i, j;
    for (i=0;i<6;i++) cube[i] = rng(0,3);
    BDD bdd = sylvan_cube(vars, cube);

    sylvan_sat_one(bdd, vars, check);
    for (i=0; i<6;i++) test_assert(cube[i] == check[i] || (cube[i] == 2 && check[i] == 0));

    BDD picked_single = sylvan_pick_single_cube(bdd, vars);
    test_assert(testEqual(sylvan_and(picked_single, bdd), picked_single));
    assert(sylvan_satcount(picked_single, vars)==1);

    BDD picked = sylvan_pick_cube(bdd);
    test_assert(testEqual(sylvan_and(picked, bdd), picked));

    BDD t1 = sylvan_cube(vars, ((uint8_t[]){1,1,2,2,0,0}));
    BDD t2 = sylvan_cube(vars, ((uint8_t[]){1,1,1,0,0,2}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,2})), sylvan_or(t1, t2)));
    t2 = sylvan_cube(vars, ((uint8_t[]){2,2,2,1,1,0}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){2,2,2,1,1,0})), sylvan_or(t1, t2)));
    t2 = sylvan_cube(vars, ((uint8_t[]){1,1,1,0,0,0}));
    test_assert(testEqual(sylvan_union_cube(t1, vars, ((uint8_t[]){1,1,1,0,0,0})), sylvan_or(t1, t2)));

    bdd = make_random(1, 16);
    for (j=0;j<10;j++) {
        for (i=0;i<6;i++) cube[i] = rng(0,3);
        BDD c = sylvan_cube(vars, cube);
        test_assert(sylvan_union_cube(bdd, vars, cube) == sylvan_or(bdd, c));
    }

    for (i=0;i<10;i++) {
        picked = sylvan_pick_cube(bdd);
        test_assert(testEqual(sylvan_and(picked, bdd), picked));
    }

    // simple test for mtbdd_enum_all
    uint8_t arr[6];
    MTBDD leaf = mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL);
    test_assert(leaf == mtbdd_true);
    test_assert(mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 0 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 0 && arr[4] == 1 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 0);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 0 && arr[5] == 1);
    test_assert(mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) == mtbdd_true);
    test_assert(arr[0] == 0 && arr[1] == 0 && arr[2] == 0 && arr[3] == 1 && arr[4] == 1 && arr[5] == 0);

    mtbdd_enum_all_first(mtbdd_true, vars, arr, NULL);
    size_t count = 1;
    while (mtbdd_enum_all_next(mtbdd_true, vars, arr, NULL) != mtbdd_false) {
        test_assert(count < 64);
        count++;
    }
    test_assert(count == 64);

    return 0;
}